

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O2

void __thiscall uint256_tests::methods::test_method(methods *this)

{
  undefined1 **ppuVar1;
  char *pcVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator pvVar4;
  iterator in_R9;
  uint256 *puVar5;
  undefined1 *puVar6;
  uint160 *puVar7;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  const_string msg_59;
  const_string msg_60;
  const_string msg_61;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  string_view str;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string file_58;
  const_string file_59;
  const_string file_60;
  const_string file_61;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  char *local_cf8;
  char *local_cf0;
  undefined1 *local_ce8;
  undefined1 *local_ce0;
  char *local_cd8;
  char *local_cd0;
  char *local_cc8;
  char *local_cc0;
  undefined1 *local_cb8;
  undefined1 *local_cb0;
  char *local_ca8;
  char *local_ca0;
  char *local_c98;
  char *local_c90;
  undefined1 *local_c88;
  undefined1 *local_c80;
  char *local_c78;
  char *local_c70;
  char *local_c68;
  char *local_c60;
  undefined1 *local_c58;
  undefined1 *local_c50;
  char *local_c48;
  char *local_c40;
  char *local_c38;
  char *local_c30;
  undefined1 *local_c28;
  undefined1 *local_c20;
  char *local_c18;
  char *local_c10;
  char *local_c08;
  char *local_c00;
  undefined1 *local_bf8;
  undefined1 *local_bf0;
  char *local_be8;
  char *local_be0;
  char *local_bd8;
  char *local_bd0;
  undefined1 *local_bc8;
  undefined1 *local_bc0;
  char *local_bb8;
  char *local_bb0;
  char *local_ba8;
  char *local_ba0;
  undefined1 *local_b98;
  undefined1 *local_b90;
  char *local_b88;
  char *local_b80;
  char *local_b78;
  char *local_b70;
  undefined1 *local_b68;
  undefined1 *local_b60;
  char *local_b58;
  char *local_b50;
  char *local_b48;
  char *local_b40;
  undefined1 *local_b38;
  undefined1 *local_b30;
  char *local_b28;
  char *local_b20;
  char *local_b18;
  char *local_b10;
  undefined1 *local_b08;
  undefined1 *local_b00;
  char *local_af8;
  char *local_af0;
  char *local_ae8;
  char *local_ae0;
  undefined1 *local_ad8;
  undefined1 *local_ad0;
  char *local_ac8;
  char *local_ac0;
  char *local_ab8;
  char *local_ab0;
  undefined1 *local_aa8;
  undefined1 *local_aa0;
  char *local_a98;
  char *local_a90;
  char *local_a88;
  char *local_a80;
  undefined1 *local_a78;
  undefined1 *local_a70;
  char *local_a68;
  char *local_a60;
  char *local_a58;
  char *local_a50;
  undefined1 *local_a48;
  undefined1 *local_a40;
  char *local_a38;
  char *local_a30;
  char *local_a28;
  char *local_a20;
  undefined1 *local_a18;
  undefined1 *local_a10;
  char *local_a08;
  char *local_a00;
  char *local_9f8;
  char *local_9f0;
  undefined1 *local_9e8;
  undefined1 *local_9e0;
  char *local_9d8;
  char *local_9d0;
  char *local_9c8;
  char *local_9c0;
  undefined1 *local_9b8;
  undefined1 *local_9b0;
  char *local_9a8;
  char *local_9a0;
  char *local_998;
  char *local_990;
  undefined1 *local_988;
  undefined1 *local_980;
  char *local_978;
  char *local_970;
  char *local_968;
  char *local_960;
  undefined1 *local_958;
  undefined1 *local_950;
  char *local_948;
  char *local_940;
  char *local_938;
  char *local_930;
  undefined1 *local_928;
  undefined1 *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  undefined1 *local_8f8;
  undefined1 *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  undefined1 *local_8c8;
  undefined1 *local_8c0;
  char *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  undefined1 *local_898;
  undefined1 *local_890;
  char *local_888;
  char *local_880;
  char *local_878;
  char *local_870;
  undefined1 *local_868;
  undefined1 *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  undefined1 *local_838;
  undefined1 *local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  undefined1 *local_808;
  undefined1 *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  undefined1 *local_7d8;
  undefined1 *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  undefined1 *local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  undefined1 *local_748;
  undefined1 *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined4 local_118;
  uint160 TmpS;
  uchar local_f4 [12];
  undefined1 local_e8 [32];
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [32];
  bool local_88;
  undefined1 local_78 [8];
  bool local_70;
  undefined7 uStack_6f;
  shared_count local_68 [2];
  uint256 TmpL;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x98;
  file.m_begin = (iterator)&local_138;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_148,msg);
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_150 = "";
  base_blob<256u>::GetHex_abi_cxx11_((string *)&TmpL,(base_blob<256u> *)R1L);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_78,(base_blob<256u> *)R1L);
  pvVar3 = (iterator)0x2;
  puVar5 = &TmpL;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_a8,&local_158,0x98,1,2,puVar5,"R1L.GetHex()",(string *)local_78,"R1L.ToString()")
  ;
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)&TmpL);
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)puVar5;
  msg_00.m_begin = pvVar3;
  file_00.m_end = (iterator)0x99;
  file_00.m_begin = (iterator)&local_168;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_178,
             msg_00);
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_180 = "";
  base_blob<256u>::GetHex_abi_cxx11_((string *)&TmpL,(base_blob<256u> *)R2L);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_78,(base_blob<256u> *)R2L);
  pvVar3 = (iterator)0x2;
  puVar5 = &TmpL;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_a8,&local_188,0x99,1,2,puVar5,"R2L.GetHex()",(string *)local_78,"R2L.ToString()")
  ;
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)&TmpL);
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)puVar5;
  msg_01.m_begin = pvVar3;
  file_01.m_end = (iterator)0x9a;
  file_01.m_begin = (iterator)&local_198;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1a8,
             msg_01);
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1b0 = "";
  base_blob<256u>::GetHex_abi_cxx11_((string *)&TmpL,(base_blob<256u> *)OneL);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_78,(base_blob<256u> *)OneL);
  pvVar3 = (iterator)0x2;
  puVar5 = &TmpL;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_a8,&local_1b8,0x9a,1,2,puVar5,"OneL.GetHex()",(string *)local_78,
             "OneL.ToString()");
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)&TmpL);
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)puVar5;
  msg_02.m_begin = pvVar3;
  file_02.m_end = (iterator)0x9b;
  file_02.m_begin = (iterator)&local_1c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1d8,
             msg_02);
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1e0 = "";
  base_blob<256u>::GetHex_abi_cxx11_((string *)&TmpL,(base_blob<256u> *)MaxL);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_78,(base_blob<256u> *)MaxL);
  pvVar3 = (iterator)0x2;
  puVar5 = &TmpL;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_a8,&local_1e8,0x9b,1,2,puVar5,"MaxL.GetHex()",(string *)local_78,
             "MaxL.ToString()");
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)&TmpL);
  TmpL.super_base_blob<256U>.m_data._M_elems[0x10] = R1L[0x10];
  TmpL.super_base_blob<256U>.m_data._M_elems[0x11] = R1L[0x11];
  TmpL.super_base_blob<256U>.m_data._M_elems[0x12] = R1L[0x12];
  TmpL.super_base_blob<256U>.m_data._M_elems[0x13] = R1L[0x13];
  TmpL.super_base_blob<256U>.m_data._M_elems[0x14] = R1L[0x14];
  TmpL.super_base_blob<256U>.m_data._M_elems[0x15] = R1L[0x15];
  TmpL.super_base_blob<256U>.m_data._M_elems[0x16] = R1L[0x16];
  TmpL.super_base_blob<256U>.m_data._M_elems[0x17] = R1L[0x17];
  TmpL.super_base_blob<256U>.m_data._M_elems[0x18] = R1L[0x18];
  TmpL.super_base_blob<256U>.m_data._M_elems[0x19] = R1L[0x19];
  TmpL.super_base_blob<256U>.m_data._M_elems[0x1a] = R1L[0x1a];
  TmpL.super_base_blob<256U>.m_data._M_elems[0x1b] = R1L[0x1b];
  TmpL.super_base_blob<256U>.m_data._M_elems[0x1c] = R1L[0x1c];
  TmpL.super_base_blob<256U>.m_data._M_elems[0x1d] = R1L[0x1d];
  TmpL.super_base_blob<256U>.m_data._M_elems[0x1e] = R1L[0x1e];
  TmpL.super_base_blob<256U>.m_data._M_elems[0x1f] = R1L[0x1f];
  TmpL.super_base_blob<256U>.m_data._M_elems[0] = R1L[0];
  TmpL.super_base_blob<256U>.m_data._M_elems[1] = R1L[1];
  TmpL.super_base_blob<256U>.m_data._M_elems[2] = R1L[2];
  TmpL.super_base_blob<256U>.m_data._M_elems[3] = R1L[3];
  TmpL.super_base_blob<256U>.m_data._M_elems[4] = R1L[4];
  TmpL.super_base_blob<256U>.m_data._M_elems[5] = R1L[5];
  TmpL.super_base_blob<256U>.m_data._M_elems[6] = R1L[6];
  TmpL.super_base_blob<256U>.m_data._M_elems[7] = R1L[7];
  TmpL.super_base_blob<256U>.m_data._M_elems[8] = R1L[8];
  TmpL.super_base_blob<256U>.m_data._M_elems[9] = R1L[9];
  TmpL.super_base_blob<256U>.m_data._M_elems[10] = R1L[10];
  TmpL.super_base_blob<256U>.m_data._M_elems[0xb] = R1L[0xb];
  TmpL.super_base_blob<256U>.m_data._M_elems[0xc] = R1L[0xc];
  TmpL.super_base_blob<256U>.m_data._M_elems[0xd] = R1L[0xd];
  TmpL.super_base_blob<256U>.m_data._M_elems[0xe] = R1L[0xe];
  TmpL.super_base_blob<256U>.m_data._M_elems[0xf] = R1L[0xf];
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)puVar5;
  msg_03.m_begin = pvVar3;
  file_03.m_end = (iterator)0x9d;
  file_03.m_begin = (iterator)&local_1f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_208,
             msg_03);
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_210 = "";
  pvVar3 = (iterator)0x2;
  puVar5 = &TmpL;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (local_a8,&local_218,0x9d,1,2,puVar5,"TmpL",R1L,"R1L");
  str._M_str = "21";
  str._M_len = 2;
  base_blob<256U>::SetHexDeprecated((base_blob<256U> *)&TmpL,str);
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)puVar5;
  msg_04.m_begin = pvVar3;
  file_04.m_end = (iterator)0xa0;
  file_04.m_begin = (iterator)&local_228;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_238,
             msg_04);
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_240 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)local_78,(base_blob<256u> *)&TmpL);
  pvVar4 = (iterator)0x2;
  pvVar3 = local_78;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (local_a8,&local_248,0xa0,1,2,pvVar3,"TmpL.ToString()",
             "0000000000000000000000000000000000000000000000000000000000000021",
             "\"0000000000000000000000000000000000000000000000000000000000000021\"");
  std::__cxx11::string::~string((string *)local_78);
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_250 = "";
  ppuVar1 = &local_268;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar3;
  msg_05.m_begin = pvVar4;
  file_05.m_end = (iterator)0xa1;
  file_05.m_begin = (iterator)&local_258;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)ppuVar1,msg_05);
  local_70 = false;
  local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_270 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)local_c8,(base_blob<256u> *)R2L);
  str_00._M_str = (char *)ppuVar1;
  str_00._M_len = local_c8._0_8_;
  detail::FromHex<uint256>((optional<uint256> *)local_a8,(detail *)local_c8._8_8_,str_00);
  if (local_88 == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    pvVar4 = (iterator)0x2;
    pvVar3 = local_a8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_78,&local_278,0xa1,1,2,pvVar3,"uint256::FromHex(R2L.ToString()).value()",R2L,
               "R2L");
    std::__cxx11::string::~string((string *)local_c8);
    local_288 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_280 = "";
    ppuVar1 = &local_298;
    local_298 = &boost::unit_test::basic_cstring<char_const>::null;
    local_290 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_06.m_end = pvVar3;
    msg_06.m_begin = pvVar4;
    file_06.m_end = (iterator)0xa2;
    file_06.m_begin = (iterator)&local_288;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)ppuVar1,msg_06
              );
    local_70 = false;
    local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
    local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
    local_2a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_2a0 = "";
    base_blob<256u>::ToString_abi_cxx11_((string *)local_c8,(base_blob<256u> *)ZeroL);
    str_01._M_str = (char *)ppuVar1;
    str_01._M_len = local_c8._0_8_;
    detail::FromHex<uint256>((optional<uint256> *)local_a8,(detail *)local_c8._8_8_,str_01);
    if (local_88 == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      local_e8._16_8_ = 0;
      local_e8._24_8_ = 0;
      local_e8._0_8_ = (pointer)0x0;
      local_e8._8_8_ = 0;
      pcVar2 = &DAT_00000001;
      pvVar4 = (iterator)0x2;
      pvVar3 = local_a8;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                (local_78,&local_2a8,0xa2);
      std::__cxx11::string::~string((string *)local_c8);
      base_blob<256u>::ToString_abi_cxx11_((string *)local_78,(base_blob<256u> *)R1L);
      str_02._M_str = pcVar2;
      str_02._M_len = (size_t)local_78;
      detail::FromHex<uint256>
                ((optional<uint256> *)local_a8,(detail *)CONCAT71(uStack_6f,local_70),str_02);
      if (local_88 == false) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_bad_optional_access();
        }
      }
      else {
        TmpL.super_base_blob<256U>.m_data._M_elems[0x10] = local_a8[0x10];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x11] = local_a8[0x11];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x12] = local_a8[0x12];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x13] = local_a8[0x13];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x14] = local_a8[0x14];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x15] = local_a8[0x15];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x16] = local_a8[0x16];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x17] = local_a8[0x17];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x18] = local_a8[0x18];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x19] = local_a8[0x19];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x1a] = local_a8[0x1a];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x1b] = local_a8[0x1b];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x1c] = local_a8[0x1c];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x1d] = local_a8[0x1d];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x1e] = local_a8[0x1e];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x1f] = local_a8[0x1f];
        TmpL.super_base_blob<256U>.m_data._M_elems[0] = local_a8[0];
        TmpL.super_base_blob<256U>.m_data._M_elems[1] = local_a8[1];
        TmpL.super_base_blob<256U>.m_data._M_elems[2] = local_a8[2];
        TmpL.super_base_blob<256U>.m_data._M_elems[3] = local_a8[3];
        TmpL.super_base_blob<256U>.m_data._M_elems[4] = local_a8[4];
        TmpL.super_base_blob<256U>.m_data._M_elems[5] = local_a8[5];
        TmpL.super_base_blob<256U>.m_data._M_elems[6] = local_a8[6];
        TmpL.super_base_blob<256U>.m_data._M_elems[7] = local_a8[7];
        TmpL.super_base_blob<256U>.m_data._M_elems[8] = local_a8[8];
        TmpL.super_base_blob<256U>.m_data._M_elems[9] = local_a8[9];
        TmpL.super_base_blob<256U>.m_data._M_elems[10] = local_a8[10];
        TmpL.super_base_blob<256U>.m_data._M_elems[0xb] = local_a8[0xb];
        TmpL.super_base_blob<256U>.m_data._M_elems[0xc] = local_a8[0xc];
        TmpL.super_base_blob<256U>.m_data._M_elems[0xd] = local_a8[0xd];
        TmpL.super_base_blob<256U>.m_data._M_elems[0xe] = local_a8[0xe];
        TmpL.super_base_blob<256U>.m_data._M_elems[0xf] = local_a8[0xf];
        std::__cxx11::string::~string((string *)local_78);
        local_2b8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_2b0 = "";
        local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_07.m_end = pvVar3;
        msg_07.m_begin = pvVar4;
        file_07.m_end = (iterator)0xa5;
        file_07.m_begin = (iterator)&local_2b8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2c8
                   ,msg_07);
        boost::test_tools::tt_detail::equal_coll_impl::operator()
                  ((assertion_result *)local_78,(equal_coll_impl *)local_c8,R1L,R1S,R1Array,
                   R1Array + 0x20);
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
        local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
        local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_2d8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_2d0 = "";
        pvVar3 = &DAT_00000001;
        pvVar4 = (iterator)0xd;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_78,(lazy_ostream *)local_a8,1,0xd,4,0xc675ee,
                   (size_t)&local_2d8,0xa5,"R1L.end()","R1Array","R1Array + uint256::size()");
        boost::detail::shared_count::~shared_count(local_68);
        local_2e8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_2e0 = "";
        local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_08.m_end = pvVar4;
        msg_08.m_begin = pvVar3;
        file_08.m_end = (iterator)0xa6;
        file_08.m_begin = (iterator)&local_2e8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2f8
                   ,msg_08);
        boost::test_tools::tt_detail::equal_coll_impl::operator()
                  ((assertion_result *)local_78,(equal_coll_impl *)local_c8,(uchar *)&TmpL,
                   (uchar *)&local_38,R1Array,R1Array + 0x20);
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
        local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
        local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_308 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_300 = "";
        pvVar3 = &DAT_00000001;
        pvVar4 = (iterator)0xd;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_78,(lazy_ostream *)local_a8,1,0xd,4,0xc677a6,
                   (size_t)&local_308,0xa6,"TmpL.end()","R1Array","R1Array + uint256::size()");
        boost::detail::shared_count::~shared_count(local_68);
        local_318 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_310 = "";
        local_328 = &boost::unit_test::basic_cstring<char_const>::null;
        local_320 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_09.m_end = pvVar4;
        msg_09.m_begin = pvVar3;
        file_09.m_end = (iterator)0xa7;
        file_09.m_begin = (iterator)&local_318;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_328
                   ,msg_09);
        boost::test_tools::tt_detail::equal_coll_impl::operator()
                  ((assertion_result *)local_78,(equal_coll_impl *)local_c8,R2L,R2S,R2Array,
                   R2Array + 0x20);
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
        local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
        local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_338 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_330 = "";
        pvVar3 = &DAT_00000001;
        pvVar4 = (iterator)0xd;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_78,(lazy_ostream *)local_a8,1,0xd,4,0xc675e1,
                   (size_t)&local_338,0xa7,"R2L.end()","R2Array","R2Array + uint256::size()");
        boost::detail::shared_count::~shared_count(local_68);
        local_348 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_340 = "";
        local_358 = &boost::unit_test::basic_cstring<char_const>::null;
        local_350 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_10.m_end = pvVar4;
        msg_10.m_begin = pvVar3;
        file_10.m_end = (iterator)0xa8;
        file_10.m_begin = (iterator)&local_348;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_358
                   ,msg_10);
        boost::test_tools::tt_detail::equal_coll_impl::operator()
                  ((assertion_result *)local_78,(equal_coll_impl *)local_c8,ZeroL,ZeroS,ZeroArray,
                   ZeroArray + 0x20);
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
        local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
        local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_368 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_360 = "";
        pvVar3 = &DAT_00000001;
        pvVar4 = (iterator)0xd;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_78,(lazy_ostream *)local_a8,1,0xd,4,0xc677ea,
                   (size_t)&local_368,0xa8,"ZeroL.end()","ZeroArray","ZeroArray + uint256::size()");
        boost::detail::shared_count::~shared_count(local_68);
        local_378 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_370 = "";
        local_388 = &boost::unit_test::basic_cstring<char_const>::null;
        local_380 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_11.m_end = pvVar4;
        msg_11.m_begin = pvVar3;
        file_11.m_end = (iterator)0xa9;
        file_11.m_begin = (iterator)&local_378;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_388
                   ,msg_11);
        boost::test_tools::tt_detail::equal_coll_impl::operator()
                  ((assertion_result *)local_78,(equal_coll_impl *)local_c8,OneL,OneS,OneArray,
                   OneArray + 0x20);
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
        local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
        local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_398 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_390 = "";
        pvVar3 = &DAT_00000001;
        pvVar4 = (iterator)0xd;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_78,(lazy_ostream *)local_a8,1,0xd,4,0xc6782a,
                   (size_t)&local_398,0xa9,"OneL.end()","OneArray","OneArray + uint256::size()");
        boost::detail::shared_count::~shared_count(local_68);
        local_3a8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_3a0 = "";
        local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_12.m_end = pvVar4;
        msg_12.m_begin = pvVar3;
        file_12.m_end = (iterator)0xaa;
        file_12.m_begin = (iterator)&local_3a8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_3b8
                   ,msg_12);
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
        local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
        local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_3c8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_3c0 = "";
        pvVar3 = local_c8;
        local_c8._0_4_ = 0x20;
        local_78 = (undefined1  [8])0x20;
        pvVar4 = (iterator)0x2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_long>
                  (local_a8,&local_3c8,0xaa,1,2,pvVar3,"R1L.size()",(assertion_result *)local_78,
                   "sizeof(R1L)");
        local_3d8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_3d0 = "";
        local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_13.m_end = pvVar3;
        msg_13.m_begin = pvVar4;
        file_13.m_end = (iterator)0xab;
        file_13.m_begin = (iterator)&local_3d8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_3e8
                   ,msg_13);
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
        local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
        local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_3f8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_3f0 = "";
        pvVar3 = local_78;
        local_78 = (undefined1  [8])0x20;
        local_c8._0_4_ = 0x20;
        pvVar4 = (iterator)0x2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                  (local_a8,&local_3f8,0xab,1,2,pvVar3,"sizeof(R1L)",local_c8,"32");
        local_408 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_400 = "";
        local_418 = &boost::unit_test::basic_cstring<char_const>::null;
        local_410 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_14.m_end = pvVar3;
        msg_14.m_begin = pvVar4;
        file_14.m_end = (iterator)0xac;
        file_14.m_begin = (iterator)&local_408;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_418
                   ,msg_14);
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
        local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
        local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_428 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_420 = "";
        pvVar3 = local_78;
        local_78._0_4_ = 0x20;
        local_c8._0_4_ = 0x20;
        pvVar4 = (iterator)0x2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                  (local_a8,&local_428,0xac,1,2,pvVar3,"R1L.size()",local_c8,"32",0x20);
        local_438 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_430 = "";
        local_448 = &boost::unit_test::basic_cstring<char_const>::null;
        local_440 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_15.m_end = pvVar3;
        msg_15.m_begin = pvVar4;
        file_15.m_end = (iterator)0xad;
        file_15.m_begin = (iterator)&local_438;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_448
                   ,msg_15);
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
        local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
        local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_458 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_450 = "";
        pvVar3 = local_78;
        local_78._0_4_ = 0x20;
        local_c8._0_4_ = 0x20;
        pvVar4 = (iterator)0x2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                  (local_a8,&local_458,0xad,1,2,pvVar3,"R2L.size()",local_c8,"32");
        local_468 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_460 = "";
        local_478 = &boost::unit_test::basic_cstring<char_const>::null;
        local_470 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_16.m_end = pvVar3;
        msg_16.m_begin = pvVar4;
        file_16.m_end = (iterator)0xae;
        file_16.m_begin = (iterator)&local_468;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_478
                   ,msg_16);
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
        local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
        local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_488 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_480 = "";
        pvVar3 = local_78;
        local_78._0_4_ = 0x20;
        local_c8._0_4_ = 0x20;
        pvVar4 = (iterator)0x2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                  (local_a8,&local_488,0xae,1,2,pvVar3,"ZeroL.size()",local_c8,"32");
        local_498 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_490 = "";
        local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_17.m_end = pvVar3;
        msg_17.m_begin = pvVar4;
        file_17.m_end = (iterator)0xaf;
        file_17.m_begin = (iterator)&local_498;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_4a8
                   ,msg_17);
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
        local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
        local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_4b8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_4b0 = "";
        pvVar3 = local_78;
        local_78._0_4_ = 0x20;
        local_c8._0_4_ = 0x20;
        pvVar4 = (iterator)0x2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                  (local_a8,&local_4b8,0xaf,1,2,pvVar3,"MaxL.size()",local_c8,"32");
        local_4c8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_4c0 = "";
        local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_18.m_end = pvVar3;
        msg_18.m_begin = pvVar4;
        file_18.m_end = (iterator)0xb0;
        file_18.m_begin = (iterator)&local_4c8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_4d8
                   ,msg_18);
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
        local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
        local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_4e8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_4e0 = "";
        pvVar3 = local_78;
        local_78 = (undefined1  [8])R1S;
        local_c8._0_8_ = R1S;
        pvVar4 = (iterator)0x2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char_const*,unsigned_char_const*>
                  (local_a8,&local_4e8,0xb0,1,2,pvVar3,"R1L.begin() + 32",local_c8,"R1L.end()");
        local_4f8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_4f0 = "";
        local_508 = &boost::unit_test::basic_cstring<char_const>::null;
        local_500 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_19.m_end = pvVar3;
        msg_19.m_begin = pvVar4;
        file_19.m_end = (iterator)0xb1;
        file_19.m_begin = (iterator)&local_4f8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_508
                   ,msg_19);
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
        local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
        local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_518 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_510 = "";
        pvVar3 = local_78;
        local_78 = (undefined1  [8])R2S;
        local_c8._0_8_ = R2S;
        pvVar4 = (iterator)0x2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char_const*,unsigned_char_const*>
                  (local_a8,&local_518,0xb1,1,2,pvVar3,"R2L.begin() + 32",local_c8,"R2L.end()");
        local_528 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_520 = "";
        local_538 = &boost::unit_test::basic_cstring<char_const>::null;
        local_530 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_20.m_end = pvVar3;
        msg_20.m_begin = pvVar4;
        file_20.m_end = (iterator)0xb2;
        file_20.m_begin = (iterator)&local_528;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_538
                   ,msg_20);
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
        local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
        local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_548 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_540 = "";
        pvVar3 = local_78;
        local_78 = (undefined1  [8])OneS;
        local_c8._0_8_ = OneS;
        pvVar4 = (iterator)0x2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char_const*,unsigned_char_const*>
                  (local_a8,&local_548,0xb2,1,2,pvVar3,"OneL.begin() + 32",local_c8,"OneL.end()");
        local_558 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_550 = "";
        local_568 = &boost::unit_test::basic_cstring<char_const>::null;
        local_560 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_21.m_end = pvVar3;
        msg_21.m_begin = pvVar4;
        file_21.m_end = (iterator)0xb3;
        file_21.m_begin = (iterator)&local_558;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_568
                   ,msg_21);
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
        local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
        local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_578 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_570 = "";
        pvVar3 = local_78;
        local_78 = (undefined1  [8])MaxS;
        local_c8._0_8_ = MaxS;
        pvVar4 = (iterator)0x2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char_const*,unsigned_char_const*>
                  (local_a8,&local_578,0xb3,1,2,pvVar3,"MaxL.begin() + 32",local_c8,"MaxL.end()");
        local_588 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_580 = "";
        local_598 = &boost::unit_test::basic_cstring<char_const>::null;
        local_590 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_22.m_end = pvVar3;
        msg_22.m_begin = pvVar4;
        file_22.m_end = (iterator)0xb4;
        file_22.m_begin = (iterator)&local_588;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_598
                   ,msg_22);
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
        local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
        local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_5a8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_5a0 = "";
        pvVar3 = local_78;
        local_c8._0_8_ = &local_38;
        pvVar4 = (iterator)0x2;
        local_78 = (undefined1  [8])local_c8._0_8_;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char*,unsigned_char*>
                  (local_a8,&local_5a8,0xb4,1,2,pvVar3,"TmpL.begin() + 32",local_c8,"TmpL.end()");
        local_5b8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_5b0 = "";
        local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_23.m_end = pvVar3;
        msg_23.m_begin = pvVar4;
        file_23.m_end = (iterator)0xb5;
        file_23.m_begin = (iterator)&local_5b8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_5c8
                   ,msg_23);
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
        local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
        local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_5d8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_5d0 = "";
        pvVar3 = local_78;
        local_78 = (undefined1  [8])0x20;
        local_c8._0_4_ = 0x20;
        pvVar4 = (iterator)0x2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                  (local_a8,&local_5d8,0xb5,1,2,pvVar3,"GetSerializeSize(R1L)",local_c8,"32");
        local_5e8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_5e0 = "";
        local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_24.m_end = pvVar3;
        msg_24.m_begin = pvVar4;
        file_24.m_end = (iterator)0xb6;
        file_24.m_begin = (iterator)&local_5e8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_5f8
                   ,msg_24);
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
        local_a8._0_8_ = &PTR__lazy_ostream_01139f30;
        local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_608 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_600 = "";
        pvVar3 = local_78;
        local_78 = (undefined1  [8])0x20;
        local_c8._0_4_ = 0x20;
        pvVar4 = (iterator)0x2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                  (local_a8,&local_608,0xb6,1,2,pvVar3,"GetSerializeSize(ZeroL)",local_c8,"32");
        local_a8._16_8_ = (undefined1 *)0x0;
        local_a8._24_8_ = 0;
        local_a8._0_8_ = (undefined **)0x0;
        local_a8._8_8_ = (undefined **)0x0;
        base_blob<256U>::Serialize<DataStream>((base_blob<256U> *)R1L,(DataStream *)local_a8);
        local_618 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_610 = "";
        local_628 = &boost::unit_test::basic_cstring<char_const>::null;
        local_620 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_25.m_end = pvVar3;
        msg_25.m_begin = pvVar4;
        file_25.m_end = (iterator)0xba;
        file_25.m_begin = (iterator)&local_618;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_628
                   ,msg_25);
        local_70 = false;
        local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
        local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
        local_638 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_630 = "";
        DataStream::str_abi_cxx11_((string *)local_c8,(DataStream *)local_a8);
        local_e8._0_8_ = local_e8 + 0x10;
        std::__cxx11::string::_M_construct<unsigned_char_const*>
                  ((string *)local_e8,R1Array,0xc68340);
        pvVar4 = (iterator)0x2;
        pvVar3 = local_c8;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                  (local_78,&local_638,0xba,1,2,pvVar3,"ss.str()",(string *)local_e8,
                   "std::string(R1Array,R1Array+32)");
        std::__cxx11::string::~string((string *)local_e8);
        std::__cxx11::string::~string((string *)local_c8);
        base_blob<256U>::Unserialize<DataStream>(&TmpL.super_base_blob<256U>,(DataStream *)local_a8)
        ;
        local_648 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_640 = "";
        local_658 = &boost::unit_test::basic_cstring<char_const>::null;
        local_650 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_26.m_end = pvVar3;
        msg_26.m_begin = pvVar4;
        file_26.m_end = (iterator)0xbc;
        file_26.m_begin = (iterator)&local_648;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_658
                   ,msg_26);
        local_70 = false;
        local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
        local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
        local_668 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_660 = "";
        puVar6 = R1L;
        pvVar3 = (iterator)0x2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                  (local_78,&local_668,0xbc,1,2,R1L,"R1L",&TmpL.super_base_blob<256U>,"TmpL");
        if (local_a8._8_8_ != local_a8._0_8_) {
          local_a8._8_8_ = local_a8._0_8_;
        }
        local_a8._24_8_ = 0;
        base_blob<256U>::Serialize<DataStream>((base_blob<256U> *)ZeroL,(DataStream *)local_a8);
        local_678 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_670 = "";
        local_688 = &boost::unit_test::basic_cstring<char_const>::null;
        local_680 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_27.m_end = puVar6;
        msg_27.m_begin = pvVar3;
        file_27.m_end = (iterator)0xbf;
        file_27.m_begin = (iterator)&local_678;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_688
                   ,msg_27);
        local_70 = false;
        local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
        local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
        local_698 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_690 = "";
        DataStream::str_abi_cxx11_((string *)local_c8,(DataStream *)local_a8);
        local_e8._0_8_ = local_e8 + 0x10;
        std::__cxx11::string::_M_construct<unsigned_char_const*>
                  ((string *)local_e8,ZeroArray,0xc683a0);
        pvVar4 = (iterator)0x2;
        pvVar3 = local_c8;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                  (local_78,&local_698,0xbf,1,2,pvVar3,"ss.str()",(string *)local_e8,
                   "std::string(ZeroArray,ZeroArray+32)");
        std::__cxx11::string::~string((string *)local_e8);
        std::__cxx11::string::~string((string *)local_c8);
        base_blob<256U>::Unserialize<DataStream>(&TmpL.super_base_blob<256U>,(DataStream *)local_a8)
        ;
        local_6a8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_6a0 = "";
        local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_28.m_end = pvVar3;
        msg_28.m_begin = pvVar4;
        file_28.m_end = (iterator)0xc1;
        file_28.m_begin = (iterator)&local_6a8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_6b8
                   ,msg_28);
        local_70 = false;
        local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
        local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
        local_6c8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_6c0 = "";
        puVar6 = ZeroL;
        pvVar3 = (iterator)0x2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                  (local_78,&local_6c8,0xc1,1,2,ZeroL,"ZeroL",&TmpL.super_base_blob<256U>,"TmpL");
        if (local_a8._8_8_ != local_a8._0_8_) {
          local_a8._8_8_ = local_a8._0_8_;
        }
        local_a8._24_8_ = 0;
        base_blob<256U>::Serialize<DataStream>((base_blob<256U> *)MaxL,(DataStream *)local_a8);
        local_6d8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_6d0 = "";
        local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_29.m_end = puVar6;
        msg_29.m_begin = pvVar3;
        file_29.m_end = (iterator)0xc4;
        file_29.m_begin = (iterator)&local_6d8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_6e8
                   ,msg_29);
        local_70 = false;
        local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
        local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
        local_6f8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_6f0 = "";
        DataStream::str_abi_cxx11_((string *)local_c8,(DataStream *)local_a8);
        local_e8._0_8_ = local_e8 + 0x10;
        std::__cxx11::string::_M_construct<unsigned_char_const*>
                  ((string *)local_e8,MaxArray,0xc68400);
        pvVar4 = (iterator)0x2;
        pvVar3 = local_c8;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                  (local_78,&local_6f8,0xc4,1,2,pvVar3,"ss.str()",(string *)local_e8,
                   "std::string(MaxArray,MaxArray+32)");
        std::__cxx11::string::~string((string *)local_e8);
        std::__cxx11::string::~string((string *)local_c8);
        base_blob<256U>::Unserialize<DataStream>(&TmpL.super_base_blob<256U>,(DataStream *)local_a8)
        ;
        local_708 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_700 = "";
        local_718 = &boost::unit_test::basic_cstring<char_const>::null;
        local_710 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_30.m_end = pvVar3;
        msg_30.m_begin = pvVar4;
        file_30.m_end = (iterator)0xc6;
        file_30.m_begin = (iterator)&local_708;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_718
                   ,msg_30);
        local_70 = false;
        local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
        local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
        local_728 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_720 = "";
        puVar6 = MaxL;
        pvVar3 = (iterator)0x2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                  (local_78,&local_728,0xc6,1,2,MaxL,"MaxL",&TmpL.super_base_blob<256U>,"TmpL");
        if (local_a8._8_8_ != local_a8._0_8_) {
          local_a8._8_8_ = local_a8._0_8_;
        }
        local_a8._24_8_ = (char *)0x0;
        local_738 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_730 = "";
        local_748 = &boost::unit_test::basic_cstring<char_const>::null;
        local_740 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_31.m_end = puVar6;
        msg_31.m_begin = pvVar3;
        file_31.m_end = (iterator)0xc9;
        file_31.m_begin = (iterator)&local_738;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_748
                   ,msg_31);
        local_70 = false;
        local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
        local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
        local_758 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_750 = "";
        base_blob<160u>::GetHex_abi_cxx11_((string *)local_c8,R1S);
        base_blob<160u>::ToString_abi_cxx11_((string *)local_e8,R1S);
        pvVar4 = (iterator)0x2;
        pvVar3 = local_c8;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                  (local_78,&local_758,0xc9,1,2,pvVar3,"R1S.GetHex()",(string *)local_e8,
                   "R1S.ToString()");
        std::__cxx11::string::~string((string *)local_e8);
        std::__cxx11::string::~string((string *)local_c8);
        local_768 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_760 = "";
        local_778 = &boost::unit_test::basic_cstring<char_const>::null;
        local_770 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_32.m_end = pvVar3;
        msg_32.m_begin = pvVar4;
        file_32.m_end = (iterator)0xca;
        file_32.m_begin = (iterator)&local_768;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_778
                   ,msg_32);
        local_70 = false;
        local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
        local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
        local_788 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_780 = "";
        base_blob<160u>::GetHex_abi_cxx11_((string *)local_c8,R2S);
        base_blob<160u>::ToString_abi_cxx11_((string *)local_e8,R2S);
        pvVar4 = (iterator)0x2;
        pvVar3 = local_c8;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                  (local_78,&local_788,0xca,1,2,pvVar3,"R2S.GetHex()",(string *)local_e8,
                   "R2S.ToString()");
        std::__cxx11::string::~string((string *)local_e8);
        std::__cxx11::string::~string((string *)local_c8);
        local_798 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_790 = "";
        local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_33.m_end = pvVar3;
        msg_33.m_begin = pvVar4;
        file_33.m_end = (iterator)0xcb;
        file_33.m_begin = (iterator)&local_798;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_7a8
                   ,msg_33);
        local_70 = false;
        local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
        local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
        local_7b8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_7b0 = "";
        base_blob<160u>::GetHex_abi_cxx11_((string *)local_c8,OneS);
        base_blob<160u>::ToString_abi_cxx11_((string *)local_e8,OneS);
        pvVar4 = (iterator)0x2;
        pvVar3 = local_c8;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                  (local_78,&local_7b8,0xcb,1,2,pvVar3,"OneS.GetHex()",(string *)local_e8,
                   "OneS.ToString()");
        std::__cxx11::string::~string((string *)local_e8);
        std::__cxx11::string::~string((string *)local_c8);
        local_7c8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_7c0 = "";
        local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_34.m_end = pvVar3;
        msg_34.m_begin = pvVar4;
        file_34.m_end = (iterator)0xcc;
        file_34.m_begin = (iterator)&local_7c8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_7d8
                   ,msg_34);
        local_70 = false;
        local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
        local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
        local_7e8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_7e0 = "";
        base_blob<160u>::GetHex_abi_cxx11_((string *)local_c8,MaxS);
        base_blob<160u>::ToString_abi_cxx11_((string *)local_e8,MaxS);
        pvVar4 = (iterator)0x2;
        pvVar3 = local_c8;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                  (local_78,&local_7e8,0xcc,1,2,pvVar3,"MaxS.GetHex()",(string *)local_e8,
                   "MaxS.ToString()");
        std::__cxx11::string::~string((string *)local_e8);
        std::__cxx11::string::~string((string *)local_c8);
        TmpS.super_base_blob<160U>.m_data._M_elems[0x10] = R1S[0x10];
        TmpS.super_base_blob<160U>.m_data._M_elems[0x11] = R1S[0x11];
        TmpS.super_base_blob<160U>.m_data._M_elems[0x12] = R1S[0x12];
        TmpS.super_base_blob<160U>.m_data._M_elems[0x13] = R1S[0x13];
        TmpS.super_base_blob<160U>.m_data._M_elems[0] = R1S[0];
        TmpS.super_base_blob<160U>.m_data._M_elems[1] = R1S[1];
        TmpS.super_base_blob<160U>.m_data._M_elems[2] = R1S[2];
        TmpS.super_base_blob<160U>.m_data._M_elems[3] = R1S[3];
        TmpS.super_base_blob<160U>.m_data._M_elems[4] = R1S[4];
        TmpS.super_base_blob<160U>.m_data._M_elems[5] = R1S[5];
        TmpS.super_base_blob<160U>.m_data._M_elems[6] = R1S[6];
        TmpS.super_base_blob<160U>.m_data._M_elems[7] = R1S[7];
        TmpS.super_base_blob<160U>.m_data._M_elems[8] = R1S[8];
        TmpS.super_base_blob<160U>.m_data._M_elems[9] = R1S[9];
        TmpS.super_base_blob<160U>.m_data._M_elems[10] = R1S[10];
        TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = R1S[0xb];
        TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = R1S[0xc];
        TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = R1S[0xd];
        TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = R1S[0xe];
        TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = R1S[0xf];
        local_7f8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_7f0 = "";
        local_808 = &boost::unit_test::basic_cstring<char_const>::null;
        local_800 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_35.m_end = pvVar3;
        msg_35.m_begin = pvVar4;
        file_35.m_end = (iterator)0xce;
        file_35.m_begin = (iterator)&local_7f8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_808
                   ,msg_35);
        local_70 = false;
        local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
        local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
        local_818 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_810 = "";
        pvVar3 = (iterator)0x2;
        puVar7 = &TmpS;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
                  (local_78,&local_818,0xce,1,2,puVar7,"TmpS",R1S,"R1S");
        local_828 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_820 = "";
        ppuVar1 = &local_838;
        local_838 = &boost::unit_test::basic_cstring<char_const>::null;
        local_830 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_36.m_end = (iterator)puVar7;
        msg_36.m_begin = pvVar3;
        file_36.m_end = (iterator)0xcf;
        file_36.m_begin = (iterator)&local_828;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)ppuVar1,
                   msg_36);
        local_70 = false;
        local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
        local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
        local_848 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_840 = "";
        base_blob<160u>::ToString_abi_cxx11_((string *)local_c8,R2S);
        str_03._M_str = (char *)ppuVar1;
        str_03._M_len = local_c8._0_8_;
        detail::FromHex<uint160>((optional<uint160> *)local_e8,(detail *)local_c8._8_8_,str_03);
        if (local_e8[0x14] == '\0') {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_bad_optional_access();
          }
        }
        else {
          pvVar4 = (iterator)0x2;
          pvVar3 = local_e8;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
                    (local_78,&local_848,0xcf,1,2,pvVar3,"uint160::FromHex(R2S.ToString()).value()",
                     R2S,"R2S");
          std::__cxx11::string::~string((string *)local_c8);
          local_858 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
          ;
          local_850 = "";
          ppuVar1 = &local_868;
          local_868 = &boost::unit_test::basic_cstring<char_const>::null;
          local_860 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_37.m_end = pvVar3;
          msg_37.m_begin = pvVar4;
          file_37.m_end = (iterator)0xd0;
          file_37.m_begin = (iterator)&local_858;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)ppuVar1,
                     msg_37);
          local_70 = false;
          local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
          local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
          local_878 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
          ;
          local_870 = "";
          base_blob<160u>::ToString_abi_cxx11_((string *)local_c8,ZeroS);
          str_04._M_str = (char *)ppuVar1;
          str_04._M_len = local_c8._0_8_;
          detail::FromHex<uint160>((optional<uint160> *)local_e8,(detail *)local_c8._8_8_,str_04);
          if (local_e8[0x14] == '\0') {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              std::__throw_bad_optional_access();
            }
          }
          else {
            local_128 = 0;
            uStack_120 = 0;
            local_118 = 0;
            pcVar2 = &DAT_00000001;
            pvVar4 = (iterator)0x2;
            pvVar3 = local_e8;
            boost::test_tools::tt_detail::
            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
                      (local_78,&local_878,0xd0);
            std::__cxx11::string::~string((string *)local_c8);
            base_blob<160u>::ToString_abi_cxx11_((string *)local_78,R1S);
            str_05._M_str = pcVar2;
            str_05._M_len = (size_t)local_78;
            detail::FromHex<uint160>
                      ((optional<uint160> *)local_c8,(detail *)CONCAT71(uStack_6f,local_70),str_05);
            if (local_b8._M_local_buf[4] == '\0') {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                std::__throw_bad_optional_access();
              }
            }
            else {
              TmpS.super_base_blob<160U>.m_data._M_elems[0x10] = local_b8._M_local_buf[0];
              TmpS.super_base_blob<160U>.m_data._M_elems[0x11] = local_b8._M_local_buf[1];
              TmpS.super_base_blob<160U>.m_data._M_elems[0x12] = local_b8._M_local_buf[2];
              TmpS.super_base_blob<160U>.m_data._M_elems[0x13] = local_b8._M_local_buf[3];
              TmpS.super_base_blob<160U>.m_data._M_elems[0] = local_c8[0];
              TmpS.super_base_blob<160U>.m_data._M_elems[1] = local_c8[1];
              TmpS.super_base_blob<160U>.m_data._M_elems[2] = local_c8[2];
              TmpS.super_base_blob<160U>.m_data._M_elems[3] = local_c8[3];
              TmpS.super_base_blob<160U>.m_data._M_elems[4] = local_c8[4];
              TmpS.super_base_blob<160U>.m_data._M_elems[5] = local_c8[5];
              TmpS.super_base_blob<160U>.m_data._M_elems[6] = local_c8[6];
              TmpS.super_base_blob<160U>.m_data._M_elems[7] = local_c8[7];
              TmpS.super_base_blob<160U>.m_data._M_elems[8] = local_c8[8];
              TmpS.super_base_blob<160U>.m_data._M_elems[9] = local_c8[9];
              TmpS.super_base_blob<160U>.m_data._M_elems[10] = local_c8[10];
              TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = local_c8[0xb];
              TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = local_c8[0xc];
              TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = local_c8[0xd];
              TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = local_c8[0xe];
              TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = local_c8[0xf];
              std::__cxx11::string::~string((string *)local_78);
              local_888 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_880 = "";
              local_898 = &boost::unit_test::basic_cstring<char_const>::null;
              local_890 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_38.m_end = pvVar3;
              msg_38.m_begin = pvVar4;
              file_38.m_end = (iterator)0xd3;
              file_38.m_begin = (iterator)&local_888;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,
                         (size_t)&local_898,msg_38);
              boost::test_tools::tt_detail::equal_coll_impl::operator()
                        ((assertion_result *)local_c8,(equal_coll_impl *)local_e8,R1S,R2L,R1Array,
                         R1Array + 0x14);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_8a8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_8a0 = "";
              pvVar3 = &DAT_00000001;
              pvVar4 = (iterator)0xd;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_c8,(lazy_ostream *)local_78,1,0xd,4,0xc679e1,
                         (size_t)&local_8a8,0xd3,"R1S.end()","R1Array","R1Array + uint160::size()");
              boost::detail::shared_count::~shared_count((shared_count *)(local_c8 + 0x10));
              local_8b8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_8b0 = "";
              local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_39.m_end = pvVar4;
              msg_39.m_begin = pvVar3;
              file_39.m_end = (iterator)0xd4;
              file_39.m_begin = (iterator)&local_8b8;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,
                         (size_t)&local_8c8,msg_39);
              boost::test_tools::tt_detail::equal_coll_impl::operator()
                        ((assertion_result *)local_c8,(equal_coll_impl *)local_e8,(uchar *)&TmpS,
                         local_f4,R1Array,R1Array + 0x14);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_8d8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_8d0 = "";
              pvVar3 = &DAT_00000001;
              pvVar4 = (iterator)0xd;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_c8,(lazy_ostream *)local_78,1,0xd,4,0xc67a11,
                         (size_t)&local_8d8,0xd4,"TmpS.end()","R1Array","R1Array + uint160::size()")
              ;
              boost::detail::shared_count::~shared_count((shared_count *)(local_c8 + 0x10));
              local_8e8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_8e0 = "";
              local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_40.m_end = pvVar4;
              msg_40.m_begin = pvVar3;
              file_40.m_end = (iterator)0xd5;
              file_40.m_begin = (iterator)&local_8e8;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,
                         (size_t)&local_8f8,msg_40);
              boost::test_tools::tt_detail::equal_coll_impl::operator()
                        ((assertion_result *)local_c8,(equal_coll_impl *)local_e8,R2S,ZeroL,R2Array,
                         R2Array + 0x14);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_908 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_900 = "";
              pvVar3 = &DAT_00000001;
              pvVar4 = (iterator)0xd;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_c8,(lazy_ostream *)local_78,1,0xd,4,0xc67a29,
                         (size_t)&local_908,0xd5,"R2S.end()","R2Array","R2Array + uint160::size()");
              boost::detail::shared_count::~shared_count((shared_count *)(local_c8 + 0x10));
              local_918 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_910 = "";
              local_928 = &boost::unit_test::basic_cstring<char_const>::null;
              local_920 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_41.m_end = pvVar4;
              msg_41.m_begin = pvVar3;
              file_41.m_end = (iterator)0xd6;
              file_41.m_begin = (iterator)&local_918;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,
                         (size_t)&local_928,msg_41);
              boost::test_tools::tt_detail::equal_coll_impl::operator()
                        ((assertion_result *)local_c8,(equal_coll_impl *)local_e8,ZeroS,OneL,
                         ZeroArray,ZeroArray + 0x14);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_938 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_930 = "";
              pvVar3 = &DAT_00000001;
              pvVar4 = (iterator)0xd;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_c8,(lazy_ostream *)local_78,1,0xd,4,0xc67a59,
                         (size_t)&local_938,0xd6,"ZeroS.end()","ZeroArray",
                         "ZeroArray + uint160::size()");
              boost::detail::shared_count::~shared_count((shared_count *)(local_c8 + 0x10));
              local_948 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_940 = "";
              local_958 = &boost::unit_test::basic_cstring<char_const>::null;
              local_950 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_42.m_end = pvVar4;
              msg_42.m_begin = pvVar3;
              file_42.m_end = (iterator)0xd7;
              file_42.m_begin = (iterator)&local_948;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,
                         (size_t)&local_958,msg_42);
              boost::test_tools::tt_detail::equal_coll_impl::operator()
                        ((assertion_result *)local_c8,(equal_coll_impl *)local_e8,OneS,MaxL,OneArray
                         ,OneArray + 0x14);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_968 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_960 = "";
              pvVar3 = &DAT_00000001;
              pvVar4 = (iterator)0xd;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_c8,(lazy_ostream *)local_78,1,0xd,4,0xc67a8f,
                         (size_t)&local_968,0xd7,"OneS.end()","OneArray",
                         "OneArray + uint160::size()");
              boost::detail::shared_count::~shared_count((shared_count *)(local_c8 + 0x10));
              local_978 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_970 = "";
              local_988 = &boost::unit_test::basic_cstring<char_const>::null;
              local_980 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_43.m_end = pvVar4;
              msg_43.m_begin = pvVar3;
              file_43.m_end = (iterator)0xd8;
              file_43.m_begin = (iterator)&local_978;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,
                         (size_t)&local_988,msg_43);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_998 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_990 = "";
              local_e8._0_4_ = 0x14;
              local_c8._0_8_ = (pointer)0x14;
              pvVar3 = (iterator)0x2;
              pvVar4 = local_e8;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_long>
                        (local_78,&local_998,0xd8,1,2,local_e8,"R1S.size()",
                         (assertion_result *)local_c8,"sizeof(R1S)");
              local_9a8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_9a0 = "";
              local_9b8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_9b0 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_44.m_end = pvVar4;
              msg_44.m_begin = pvVar3;
              file_44.m_end = (iterator)0xd9;
              file_44.m_begin = (iterator)&local_9a8;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,
                         (size_t)&local_9b8,msg_44);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_9c8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_9c0 = "";
              pvVar3 = local_c8;
              local_c8._0_8_ = (pointer)0x14;
              local_e8._0_4_ = 0x14;
              pvVar4 = (iterator)0x2;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                        (local_78,&local_9c8,0xd9,1,2,pvVar3,"sizeof(R1S)",local_e8,"20");
              local_9d8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_9d0 = "";
              local_9e8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_9e0 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_45.m_end = pvVar3;
              msg_45.m_begin = pvVar4;
              file_45.m_end = (iterator)0xda;
              file_45.m_begin = (iterator)&local_9d8;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,
                         (size_t)&local_9e8,msg_45);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_9f8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_9f0 = "";
              pvVar3 = local_c8;
              local_c8._0_4_ = 0x14;
              local_e8._0_4_ = 0x14;
              pvVar4 = (iterator)0x2;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                        (local_78,&local_9f8,0xda,1,2,pvVar3,"R1S.size()",local_e8,"20",0x14);
              local_a08 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_a00 = "";
              local_a18 = &boost::unit_test::basic_cstring<char_const>::null;
              local_a10 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_46.m_end = pvVar3;
              msg_46.m_begin = pvVar4;
              file_46.m_end = (iterator)0xdb;
              file_46.m_begin = (iterator)&local_a08;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,
                         (size_t)&local_a18,msg_46);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_a28 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_a20 = "";
              pvVar3 = local_c8;
              local_c8._0_4_ = 0x14;
              local_e8._0_4_ = 0x14;
              pvVar4 = (iterator)0x2;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                        (local_78,&local_a28,0xdb,1,2,pvVar3,"R2S.size()",local_e8,"20");
              local_a38 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_a30 = "";
              local_a48 = &boost::unit_test::basic_cstring<char_const>::null;
              local_a40 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_47.m_end = pvVar3;
              msg_47.m_begin = pvVar4;
              file_47.m_end = (iterator)0xdc;
              file_47.m_begin = (iterator)&local_a38;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,
                         (size_t)&local_a48,msg_47);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_a58 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_a50 = "";
              pvVar3 = local_c8;
              local_c8._0_4_ = 0x14;
              local_e8._0_4_ = 0x14;
              pvVar4 = (iterator)0x2;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                        (local_78,&local_a58,0xdc,1,2,pvVar3,"ZeroS.size()",local_e8,"20");
              local_a68 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_a60 = "";
              local_a78 = &boost::unit_test::basic_cstring<char_const>::null;
              local_a70 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_48.m_end = pvVar3;
              msg_48.m_begin = pvVar4;
              file_48.m_end = (iterator)0xdd;
              file_48.m_begin = (iterator)&local_a68;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,
                         (size_t)&local_a78,msg_48);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_a88 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_a80 = "";
              pvVar3 = local_c8;
              local_c8._0_4_ = 0x14;
              local_e8._0_4_ = 0x14;
              pvVar4 = (iterator)0x2;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                        (local_78,&local_a88,0xdd,1,2,pvVar3,"MaxS.size()",local_e8,"20");
              local_a98 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_a90 = "";
              local_aa8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_aa0 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_49.m_end = pvVar3;
              msg_49.m_begin = pvVar4;
              file_49.m_end = (iterator)0xde;
              file_49.m_begin = (iterator)&local_a98;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,
                         (size_t)&local_aa8,msg_49);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_ab8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_ab0 = "";
              pvVar3 = local_c8;
              local_c8._0_8_ = R2L;
              local_e8._0_8_ = R2L;
              pvVar4 = (iterator)0x2;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char_const*,unsigned_char_const*>
                        (local_78,&local_ab8,0xde,1,2,pvVar3,"R1S.begin() + 20",local_e8,"R1S.end()"
                        );
              local_ac8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_ac0 = "";
              local_ad8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_ad0 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_50.m_end = pvVar3;
              msg_50.m_begin = pvVar4;
              file_50.m_end = (iterator)0xdf;
              file_50.m_begin = (iterator)&local_ac8;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,
                         (size_t)&local_ad8,msg_50);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_ae8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_ae0 = "";
              pvVar3 = local_c8;
              local_c8._0_8_ = ZeroL;
              local_e8._0_8_ = ZeroL;
              pvVar4 = (iterator)0x2;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char_const*,unsigned_char_const*>
                        (local_78,&local_ae8,0xdf,1,2,pvVar3,"R2S.begin() + 20",local_e8,"R2S.end()"
                        );
              local_af8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_af0 = "";
              local_b08 = &boost::unit_test::basic_cstring<char_const>::null;
              local_b00 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_51.m_end = pvVar3;
              msg_51.m_begin = pvVar4;
              file_51.m_end = (iterator)0xe0;
              file_51.m_begin = (iterator)&local_af8;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,
                         (size_t)&local_b08,msg_51);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_b18 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_b10 = "";
              pvVar3 = local_c8;
              local_c8._0_8_ = MaxL;
              local_e8._0_8_ = MaxL;
              pvVar4 = (iterator)0x2;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char_const*,unsigned_char_const*>
                        (local_78,&local_b18,0xe0,1,2,pvVar3,"OneS.begin() + 20",local_e8,
                         "OneS.end()");
              local_b28 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_b20 = "";
              local_b38 = &boost::unit_test::basic_cstring<char_const>::null;
              local_b30 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_52.m_end = pvVar3;
              msg_52.m_begin = pvVar4;
              file_52.m_end = (iterator)0xe1;
              file_52.m_begin = (iterator)&local_b28;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,
                         (size_t)&local_b38,msg_52);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_b48 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_b40 = "";
              pvVar3 = local_c8;
              local_c8._0_8_ = &basics_registrar633;
              local_e8._0_8_ = &basics_registrar633;
              pvVar4 = (iterator)0x2;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char_const*,unsigned_char_const*>
                        (local_78,&local_b48,0xe1,1,2,pvVar3,"MaxS.begin() + 20",local_e8,
                         "MaxS.end()");
              local_b58 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_b50 = "";
              local_b68 = &boost::unit_test::basic_cstring<char_const>::null;
              local_b60 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_53.m_end = pvVar3;
              msg_53.m_begin = pvVar4;
              file_53.m_end = (iterator)0xe2;
              file_53.m_begin = (iterator)&local_b58;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,
                         (size_t)&local_b68,msg_53);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_b78 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_b70 = "";
              pvVar3 = local_c8;
              local_e8._0_8_ = local_f4;
              pvVar4 = (iterator)0x2;
              local_c8._0_8_ = local_e8._0_8_;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char*,unsigned_char*>
                        (local_78,&local_b78,0xe2,1,2,pvVar3,"TmpS.begin() + 20",local_e8,
                         "TmpS.end()");
              local_b88 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_b80 = "";
              local_b98 = &boost::unit_test::basic_cstring<char_const>::null;
              local_b90 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_54.m_end = pvVar3;
              msg_54.m_begin = pvVar4;
              file_54.m_end = (iterator)0xe3;
              file_54.m_begin = (iterator)&local_b88;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,
                         (size_t)&local_b98,msg_54);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_ba8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_ba0 = "";
              pvVar3 = local_c8;
              local_c8._0_8_ = (pointer)0x14;
              local_e8._0_4_ = 0x14;
              pvVar4 = (iterator)0x2;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                        (local_78,&local_ba8,0xe3,1,2,pvVar3,"GetSerializeSize(R1S)",local_e8,"20");
              local_bb8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_bb0 = "";
              local_bc8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_bc0 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_55.m_end = pvVar3;
              msg_55.m_begin = pvVar4;
              file_55.m_end = (iterator)0xe4;
              file_55.m_begin = (iterator)&local_bb8;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,
                         (size_t)&local_bc8,msg_55);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_bd8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_bd0 = "";
              pvVar3 = local_c8;
              local_c8._0_8_ = (pointer)0x14;
              local_e8._0_4_ = 0x14;
              pvVar4 = (iterator)0x2;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                        (local_78,&local_bd8,0xe4,1,2,pvVar3,"GetSerializeSize(ZeroS)",local_e8,"20"
                        );
              base_blob<160U>::Serialize<DataStream>((base_blob<160U> *)R1S,(DataStream *)local_a8);
              local_be8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_be0 = "";
              local_bf8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_bf0 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_56.m_end = pvVar3;
              msg_56.m_begin = pvVar4;
              file_56.m_end = (iterator)0xe7;
              file_56.m_begin = (iterator)&local_be8;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,
                         (size_t)&local_bf8,msg_56);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_c08 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_c00 = "";
              DataStream::str_abi_cxx11_((string *)local_c8,(DataStream *)local_a8);
              local_e8._0_8_ = local_e8 + 0x10;
              std::__cxx11::string::_M_construct<unsigned_char_const*>
                        ((string *)local_e8,R1Array,0xc68334);
              pvVar4 = (iterator)0x2;
              pvVar3 = local_c8;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                        (local_78,&local_c08,0xe7,1,2,pvVar3,"ss.str()",(string *)local_e8,
                         "std::string(R1Array,R1Array+20)");
              std::__cxx11::string::~string((string *)local_e8);
              std::__cxx11::string::~string((string *)local_c8);
              base_blob<160U>::Unserialize<DataStream>
                        (&TmpS.super_base_blob<160U>,(DataStream *)local_a8);
              local_c18 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_c10 = "";
              local_c28 = &boost::unit_test::basic_cstring<char_const>::null;
              local_c20 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_57.m_end = pvVar3;
              msg_57.m_begin = pvVar4;
              file_57.m_end = (iterator)0xe9;
              file_57.m_begin = (iterator)&local_c18;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,
                         (size_t)&local_c28,msg_57);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_c38 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_c30 = "";
              puVar6 = R1S;
              pvVar3 = (iterator)0x2;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
                        (local_78,&local_c38,0xe9,1,2,R1S,"R1S",&TmpS.super_base_blob<160U>,"TmpS");
              if (local_a8._8_8_ != local_a8._0_8_) {
                local_a8._8_8_ = local_a8._0_8_;
              }
              local_a8._24_8_ = 0;
              base_blob<160U>::Serialize<DataStream>
                        ((base_blob<160U> *)ZeroS,(DataStream *)local_a8);
              local_c48 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_c40 = "";
              local_c58 = &boost::unit_test::basic_cstring<char_const>::null;
              local_c50 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_58.m_end = puVar6;
              msg_58.m_begin = pvVar3;
              file_58.m_end = (iterator)0xec;
              file_58.m_begin = (iterator)&local_c48;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_58,
                         (size_t)&local_c58,msg_58);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_c68 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_c60 = "";
              DataStream::str_abi_cxx11_((string *)local_c8,(DataStream *)local_a8);
              local_e8._0_8_ = local_e8 + 0x10;
              std::__cxx11::string::_M_construct<unsigned_char_const*>
                        ((string *)local_e8,ZeroArray,0xc68394);
              pvVar4 = (iterator)0x2;
              pvVar3 = local_c8;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                        (local_78,&local_c68,0xec,1,2,pvVar3,"ss.str()",(string *)local_e8,
                         "std::string(ZeroArray,ZeroArray+20)");
              std::__cxx11::string::~string((string *)local_e8);
              std::__cxx11::string::~string((string *)local_c8);
              base_blob<160U>::Unserialize<DataStream>
                        (&TmpS.super_base_blob<160U>,(DataStream *)local_a8);
              local_c78 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_c70 = "";
              local_c88 = &boost::unit_test::basic_cstring<char_const>::null;
              local_c80 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_59.m_end = pvVar3;
              msg_59.m_begin = pvVar4;
              file_59.m_end = (iterator)0xee;
              file_59.m_begin = (iterator)&local_c78;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_59,
                         (size_t)&local_c88,msg_59);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_c98 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_c90 = "";
              puVar6 = ZeroS;
              pvVar3 = (iterator)0x2;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
                        (local_78,&local_c98,0xee,1,2,ZeroS,"ZeroS",&TmpS.super_base_blob<160U>,
                         "TmpS");
              if (local_a8._8_8_ != local_a8._0_8_) {
                local_a8._8_8_ = local_a8._0_8_;
              }
              local_a8._24_8_ = 0;
              base_blob<160U>::Serialize<DataStream>((base_blob<160U> *)MaxS,(DataStream *)local_a8)
              ;
              local_ca8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_ca0 = "";
              local_cb8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_cb0 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_60.m_end = puVar6;
              msg_60.m_begin = pvVar3;
              file_60.m_end = (iterator)0xf1;
              file_60.m_begin = (iterator)&local_ca8;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_60,
                         (size_t)&local_cb8,msg_60);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_cc8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_cc0 = "";
              DataStream::str_abi_cxx11_((string *)local_c8,(DataStream *)local_a8);
              local_e8._0_8_ = local_e8 + 0x10;
              std::__cxx11::string::_M_construct<unsigned_char_const*>
                        ((string *)local_e8,MaxArray,0xc683f4);
              pvVar4 = (iterator)0x2;
              pvVar3 = local_c8;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                        (local_78,&local_cc8,0xf1,1,2,pvVar3,"ss.str()",(string *)local_e8,
                         "std::string(MaxArray,MaxArray+20)");
              std::__cxx11::string::~string((string *)local_e8);
              std::__cxx11::string::~string((string *)local_c8);
              base_blob<160U>::Unserialize<DataStream>
                        (&TmpS.super_base_blob<160U>,(DataStream *)local_a8);
              local_cd8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_cd0 = "";
              local_ce8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_ce0 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_61.m_end = pvVar3;
              msg_61.m_begin = pvVar4;
              file_61.m_end = (iterator)0xf3;
              file_61.m_begin = (iterator)&local_cd8;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_61,
                         (size_t)&local_ce8,msg_61);
              local_70 = false;
              local_78 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
              local_68[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_68[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_cf8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_cf0 = "";
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
                        (local_78,&local_cf8,0xf3,1,2,MaxS,"MaxS",&TmpS.super_base_blob<160U>,"TmpS"
                        );
              if (local_a8._8_8_ != local_a8._0_8_) {
                local_a8._8_8_ = local_a8._0_8_;
              }
              local_a8._24_8_ = (char *)0x0;
              std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                        ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_a8)
              ;
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                return;
              }
            }
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(methods) // GetHex SetHexDeprecated FromHex begin() end() size() GetLow64 GetSerializeSize, Serialize, Unserialize
{
    BOOST_CHECK_EQUAL(R1L.GetHex(), R1L.ToString());
    BOOST_CHECK_EQUAL(R2L.GetHex(), R2L.ToString());
    BOOST_CHECK_EQUAL(OneL.GetHex(), OneL.ToString());
    BOOST_CHECK_EQUAL(MaxL.GetHex(), MaxL.ToString());
    uint256 TmpL(R1L);
    BOOST_CHECK_EQUAL(TmpL, R1L);
    // Verify previous values don't persist when setting to truncated string.
    TmpL.SetHexDeprecated("21");
    BOOST_CHECK_EQUAL(TmpL.ToString(), "0000000000000000000000000000000000000000000000000000000000000021");
    BOOST_CHECK_EQUAL(uint256::FromHex(R2L.ToString()).value(), R2L);
    BOOST_CHECK_EQUAL(uint256::FromHex(ZeroL.ToString()).value(), uint256());

    TmpL = uint256::FromHex(R1L.ToString()).value();
    BOOST_CHECK_EQUAL_COLLECTIONS(R1L.begin(), R1L.end(), R1Array, R1Array + uint256::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(TmpL.begin(), TmpL.end(), R1Array, R1Array + uint256::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(R2L.begin(), R2L.end(), R2Array, R2Array + uint256::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(ZeroL.begin(), ZeroL.end(), ZeroArray, ZeroArray + uint256::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(OneL.begin(), OneL.end(), OneArray, OneArray + uint256::size());
    BOOST_CHECK_EQUAL(R1L.size(), sizeof(R1L));
    BOOST_CHECK_EQUAL(sizeof(R1L), 32);
    BOOST_CHECK_EQUAL(R1L.size(), 32);
    BOOST_CHECK_EQUAL(R2L.size(), 32);
    BOOST_CHECK_EQUAL(ZeroL.size(), 32);
    BOOST_CHECK_EQUAL(MaxL.size(), 32);
    BOOST_CHECK_EQUAL(R1L.begin() + 32, R1L.end());
    BOOST_CHECK_EQUAL(R2L.begin() + 32, R2L.end());
    BOOST_CHECK_EQUAL(OneL.begin() + 32, OneL.end());
    BOOST_CHECK_EQUAL(MaxL.begin() + 32, MaxL.end());
    BOOST_CHECK_EQUAL(TmpL.begin() + 32, TmpL.end());
    BOOST_CHECK_EQUAL(GetSerializeSize(R1L), 32);
    BOOST_CHECK_EQUAL(GetSerializeSize(ZeroL), 32);

    DataStream ss{};
    ss << R1L;
    BOOST_CHECK_EQUAL(ss.str(), std::string(R1Array,R1Array+32));
    ss >> TmpL;
    BOOST_CHECK_EQUAL(R1L, TmpL);
    ss.clear();
    ss << ZeroL;
    BOOST_CHECK_EQUAL(ss.str(), std::string(ZeroArray,ZeroArray+32));
    ss >> TmpL;
    BOOST_CHECK_EQUAL(ZeroL, TmpL);
    ss.clear();
    ss << MaxL;
    BOOST_CHECK_EQUAL(ss.str(), std::string(MaxArray,MaxArray+32));
    ss >> TmpL;
    BOOST_CHECK_EQUAL(MaxL, TmpL);
    ss.clear();

    BOOST_CHECK_EQUAL(R1S.GetHex(), R1S.ToString());
    BOOST_CHECK_EQUAL(R2S.GetHex(), R2S.ToString());
    BOOST_CHECK_EQUAL(OneS.GetHex(), OneS.ToString());
    BOOST_CHECK_EQUAL(MaxS.GetHex(), MaxS.ToString());
    uint160 TmpS(R1S);
    BOOST_CHECK_EQUAL(TmpS, R1S);
    BOOST_CHECK_EQUAL(uint160::FromHex(R2S.ToString()).value(), R2S);
    BOOST_CHECK_EQUAL(uint160::FromHex(ZeroS.ToString()).value(), uint160());

    TmpS = uint160::FromHex(R1S.ToString()).value();
    BOOST_CHECK_EQUAL_COLLECTIONS(R1S.begin(), R1S.end(), R1Array, R1Array + uint160::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(TmpS.begin(), TmpS.end(), R1Array, R1Array + uint160::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(R2S.begin(), R2S.end(), R2Array, R2Array + uint160::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(ZeroS.begin(), ZeroS.end(), ZeroArray, ZeroArray + uint160::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(OneS.begin(), OneS.end(), OneArray, OneArray + uint160::size());
    BOOST_CHECK_EQUAL(R1S.size(), sizeof(R1S));
    BOOST_CHECK_EQUAL(sizeof(R1S), 20);
    BOOST_CHECK_EQUAL(R1S.size(), 20);
    BOOST_CHECK_EQUAL(R2S.size(), 20);
    BOOST_CHECK_EQUAL(ZeroS.size(), 20);
    BOOST_CHECK_EQUAL(MaxS.size(), 20);
    BOOST_CHECK_EQUAL(R1S.begin() + 20, R1S.end());
    BOOST_CHECK_EQUAL(R2S.begin() + 20, R2S.end());
    BOOST_CHECK_EQUAL(OneS.begin() + 20, OneS.end());
    BOOST_CHECK_EQUAL(MaxS.begin() + 20, MaxS.end());
    BOOST_CHECK_EQUAL(TmpS.begin() + 20, TmpS.end());
    BOOST_CHECK_EQUAL(GetSerializeSize(R1S), 20);
    BOOST_CHECK_EQUAL(GetSerializeSize(ZeroS), 20);

    ss << R1S;
    BOOST_CHECK_EQUAL(ss.str(), std::string(R1Array,R1Array+20));
    ss >> TmpS;
    BOOST_CHECK_EQUAL(R1S, TmpS);
    ss.clear();
    ss << ZeroS;
    BOOST_CHECK_EQUAL(ss.str(), std::string(ZeroArray,ZeroArray+20));
    ss >> TmpS;
    BOOST_CHECK_EQUAL(ZeroS, TmpS);
    ss.clear();
    ss << MaxS;
    BOOST_CHECK_EQUAL(ss.str(), std::string(MaxArray,MaxArray+20));
    ss >> TmpS;
    BOOST_CHECK_EQUAL(MaxS, TmpS);
    ss.clear();
}